

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::~Branch(Branch *this)

{
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0042eab8;
  Own<kj::_::PromiseNode>::dispose(&this->dependency);
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::~Branch() noexcept(false) {}